

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memtable.cc
# Opt level: O0

int __thiscall
leveldb::MemTable::KeyComparator::operator()(KeyComparator *this,char *aptr,char *bptr)

{
  int iVar1;
  char *in_RDI;
  Slice *unaff_retaddr;
  Slice *in_stack_00000008;
  Slice b;
  Slice a;
  
  GetLengthPrefixedSlice(in_RDI);
  GetLengthPrefixedSlice(in_RDI);
  iVar1 = InternalKeyComparator::Compare
                    ((InternalKeyComparator *)b.data_,in_stack_00000008,unaff_retaddr);
  return iVar1;
}

Assistant:

int MemTable::KeyComparator::operator()(const char* aptr,
                                        const char* bptr) const {
  // Internal keys are encoded as length-prefixed strings.
  Slice a = GetLengthPrefixedSlice(aptr);
  Slice b = GetLengthPrefixedSlice(bptr);
  return comparator.Compare(a, b);
}